

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O2

void Cnf_ManFreeCuts(Cnf_Man_t *p)

{
  Vec_Ptr_t *p_00;
  void *pvVar1;
  int i;
  int i_00;
  
  for (i_00 = 0; p_00 = p->pManAig->vObjs, i_00 < p_00->nSize; i_00 = i_00 + 1) {
    pvVar1 = Vec_PtrEntry(p_00,i_00);
    if ((pvVar1 != (void *)0x0) && (*(Cnf_Cut_t **)((long)pvVar1 + 0x28) != (Cnf_Cut_t *)0x0)) {
      Cnf_CutFree(*(Cnf_Cut_t **)((long)pvVar1 + 0x28));
      *(undefined8 *)((long)pvVar1 + 0x28) = 0;
    }
  }
  return;
}

Assistant:

void Cnf_ManFreeCuts( Cnf_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p->pManAig, pObj, i )
        if ( pObj->pData )
        {
            Cnf_CutFree( (Cnf_Cut_t *)pObj->pData );
            pObj->pData = NULL;
        }
}